

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

ForNonContainerNonPointer<std::__exception_ptr::exception_ptr,_std::string> *
lest::to_string<std::__exception_ptr::exception_ptr>
          (ForNonContainerNonPointer<std::__exception_ptr::exception_ptr,_std::string>
           *__return_storage_ptr__,exception_ptr *item)

{
  exception_ptr *item_local;
  
  make_string<std::__exception_ptr::exception_ptr>(__return_storage_ptr__,item);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( T const & item ) -> ForNonContainerNonPointer<T, std::string>
{
    return make_string( item );
}